

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equivalent.cpp
# Opt level: O1

bool fs_equivalent(string_view path1,string_view path2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Bool _Var2;
  undefined1 uVar3;
  char *pcVar4;
  string_view path1_00;
  string_view path2_00;
  string_view path;
  string_view path_00;
  string_view fname;
  string p2;
  string p1;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  size_t local_a0;
  char *local_98;
  path local_90;
  error_code local_68;
  path local_58;
  
  pcVar4 = path2._M_str;
  path2_00._M_len = path2._M_len;
  path1_00._M_str = path1._M_str;
  local_68._M_value = 0;
  local_68._M_cat = (error_category *)std::_V2::system_category();
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,path1_00._M_str,path1_00._M_str + path1._M_len);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,pcVar4,pcVar4 + path2_00._M_len);
  _Var2 = fs_is_mingw();
  if (_Var2) {
    path._M_str = local_c0._M_dataplus._M_p;
    path._M_len = local_c0._M_string_length;
    fs_canonical_abi_cxx11_(&local_90._M_pathname,path,true,false);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_90);
    paVar1 = &local_90._M_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_pathname._M_dataplus._M_p,
                      local_90._M_pathname.field_2._M_allocated_capacity + 1);
    }
    path_00._M_str = local_e0._M_dataplus._M_p;
    path_00._M_len = local_e0._M_string_length;
    fs_canonical_abi_cxx11_(&local_90._M_pathname,path_00,true,false);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_pathname._M_dataplus._M_p,
                      local_90._M_pathname.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_90,&local_c0,auto_format);
  local_a0 = path1._M_len;
  local_98 = pcVar4;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_58,&local_e0,auto_format);
  uVar3 = std::filesystem::equivalent(&local_90,&local_58,&local_68);
  std::filesystem::__cxx11::path::~path(&local_58);
  std::filesystem::__cxx11::path::~path(&local_90);
  if (local_68._M_value != 0) {
    path1_00._M_len = local_a0;
    path2_00._M_str = local_98;
    fname._M_str = "fs_equivalent";
    fname._M_len = 0xd;
    fs_print_error(path1_00,path2_00,fname,&local_68);
    uVar3 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return (bool)uVar3;
}

Assistant:

bool fs_equivalent(std::string_view path1, std::string_view path2)
{
  // non-existent paths are not equivalent

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM

  std::string p1(path1);
  std::string p2(path2);

  if(fs_is_mingw()){
    // MinGW falsely gives mismatch if not canonicalized
    p1 = fs_canonical(p1, true, false);
    p2 = fs_canonical(p2, true, false);
  }

  bool e = std::filesystem::equivalent(p1, p2, ec);
  if(!ec)
    return e;

#else

  int r1 = 0;
  int r2 = 0;

#if defined(STATX_BASIC_STATS) && defined(USE_STATX)

  struct statx x1;
  struct statx x2;

  r1 = statx(AT_FDCWD, path1.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x1);
  if(r1 == 0){
    r2 = statx(AT_FDCWD, path2.data(), AT_NO_AUTOMOUNT, STATX_BASIC_STATS, &x2);
    if(r2 == 0)
      return x1.stx_dev_major == x2.stx_dev_major && x1.stx_dev_minor == x2.stx_dev_minor && x1.stx_ino == x2.stx_ino;
  }

#endif

  if((r1 == 0 && r2 == 0) || errno == ENOSYS){
    struct stat s1;
    struct stat s2;

    // https://www.boost.org/doc/libs/1_86_0/libs/filesystem/doc/reference.html#equivalent
    if(!stat(path1.data(), &s1) && !stat(path2.data(), &s2))
      return s1.st_dev == s2.st_dev && s1.st_ino == s2.st_ino;
  }

#endif

  fs_print_error(path1, path2, __func__, ec);
  return false;
}